

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

bool __thiscall
LZ77Compressor::search
          (LZ77Compressor *this,uint8_t *bytes,int srcOffset,int maxLen,int *matchOff,int *matchLen)

{
  bool bVar1;
  int iVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  reference piVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int off2;
  int i;
  int off;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *v;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  int local_54;
  int local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_30;
  int *local_28;
  int *local_20;
  int local_18;
  int local_14;
  long local_10;
  
  __lhs = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)(in_RDI + 0x20);
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar2 = hash((uint8_t *)(in_RSI + in_EDX));
  local_38 = __lhs + (long)iVar2 * 3;
  *local_20 = -1;
  *local_28 = 2;
  local_30 = local_38;
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           (__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffff98), bVar1) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_40);
    iVar2 = *piVar3;
    local_50 = 0;
    local_54 = iVar2;
    if (local_14 < iVar2 + local_18) {
      for (; local_50 < local_18; local_50 = local_50 + 1) {
        if (local_14 <= local_54) {
          local_54 = iVar2;
        }
        if (*(char *)(local_10 + local_54) != *(char *)(local_10 + (local_14 + local_50))) break;
        local_54 = local_54 + 1;
      }
    }
    else {
      while ((local_50 < local_18 &&
             (*(char *)(local_10 + (iVar2 + local_50)) ==
              *(char *)(local_10 + (local_14 + local_50))))) {
        local_50 = local_50 + 1;
      }
    }
    if (*local_28 < local_50) {
      *local_20 = iVar2;
      *local_28 = local_50;
      if (*local_28 == local_18) break;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40);
  }
  return 2 < *local_28;
}

Assistant:

bool search(const uint8_t* bytes, int srcOffset, int maxLen, int& matchOff, int& matchLen) {
		auto& v = dict[hash(bytes + srcOffset)];

		matchOff = -1;
		matchLen = 2;

		for (int off : v) {
			int i = 0;
			if (off + maxLen > srcOffset) {
				// Unlikely, will wrap
				for (int off2 = off; i < maxLen; i++, off2++) {
					if (off2 >= srcOffset) {
						off2 = off;
					}
					if (bytes[off2] != bytes[srcOffset + i]) { break; }
				}
			} else {
				for (; i < maxLen; i++) {
					if (bytes[off + i] != bytes[srcOffset + i]) { break; }
				}
			}
			if (i > matchLen) {
				matchOff = off;
				matchLen = i;
				if (matchLen == maxLen) { break; }
			}
		}

		return matchLen > 2;
	}